

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::FunctionDeclarationNode::BuildProgram
          (FunctionDeclarationNode *this,Scope *scope,ostream *out)

{
  const_reference pvVar1;
  pointer pAVar2;
  string *name;
  ASTTokenBasic *local_40;
  ostream *out_local;
  Scope *scope_local;
  FunctionDeclarationNode *this_local;
  
  pvVar1 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,1);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::get(pvVar1);
  if (pAVar2 == (pointer)0x0) {
    local_40 = (ASTTokenBasic *)0x0;
  }
  else {
    local_40 = (ASTTokenBasic *)
               __dynamic_cast(pAVar2,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
  }
  name = ASTTokenBasic::GetStr_abi_cxx11_(local_40);
  vpl::Scope::DeclareFunction(scope,name);
  pvVar1 = std::
           vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
           ::operator[](&(this->super_ASTNodeBasic).children_,2);
  pAVar2 = std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
           ::operator->(pvVar1);
  (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
  vpl::Scope::EndFunctionDeclaration(scope);
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                scope->DeclareFunction(GET_TOKEN_STRING(children_[1]));
                children_[2]->BuildProgram(scope, out);
                scope->EndFunctionDeclaration();
            }